

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *os;
  ColourImpl *pCVar2;
  pointer pMVar3;
  Code CVar4;
  Code CVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  Code CVar11;
  pointer pMVar12;
  long lVar13;
  long local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 local_a8 [48];
  size_t local_78;
  string local_68;
  ColourGuard local_48;
  ConsoleReporter *local_38;
  
  iVar8 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  bVar6 = 1;
  if (((char)iVar8 == '\0') &&
     ((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
      (OVar1 & FailureBit) == Ok ||
      (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    bVar6 = 0;
    if ((OVar1 != ExplicitSkip) && (bVar6 = 0, OVar1 != Warning)) {
      return;
    }
  }
  lazyPrint(this);
  os = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  pCVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  CVar11 = None;
  local_b8 = "";
  CVar4 = BrightRed;
  CVar5 = Green;
  switch(OVar1) {
  case Ok:
    lVar13 = (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_b0 = "PASSED";
    if (lVar13 != 0x48) {
      local_b8 = "";
      local_c0 = 0;
      if (1 < (ulong)(lVar13 / 0x48)) {
        local_b8 = "with messages";
        local_c0 = 0xd;
      }
LAB_00144917:
      lVar13 = 6;
      CVar11 = CVar5;
      break;
    }
    lVar13 = 6;
    CVar11 = CVar5;
    goto LAB_00144769;
  case Info:
    local_c0 = 4;
    local_b8 = "info";
    goto LAB_00144793;
  case Warning:
    local_c0 = 7;
    local_b8 = "warning";
LAB_00144793:
    local_b0 = "";
    CVar11 = None;
    lVar13 = 0;
    break;
  case Warning|Info:
  case ExplicitSkip|Info:
  case ExplicitSkip|Warning:
  case ExplicitSkip|Warning|Info:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    local_b0 = "";
    lVar13 = 0;
    local_c0 = 0;
    break;
  case ExplicitSkip:
    lVar9 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    lVar13 = 7;
    CVar11 = FileName;
    local_b0 = "SKIPPED";
    if (lVar9 != 0x48) {
      local_b8 = "";
      local_c0 = 0;
      if (1 < (ulong)(lVar9 / 0x48)) {
        local_b8 = "explicitly with messages";
        local_c0 = 0x18;
      }
      break;
    }
    goto LAB_001447d1;
  case ExpressionFailed:
    bVar7 = ((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0;
    CVar11 = CVar5;
    if (bVar7) {
      CVar11 = BrightRed;
    }
    local_b0 = "FAILED - but was ok";
    if (bVar7) {
      local_b0 = "FAILED";
    }
    lVar13 = 0x13;
    if (bVar7) {
      lVar13 = 6;
    }
    lVar9 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar9 != 0x48) {
      local_b8 = "";
      local_c0 = 0;
      if (1 < (ulong)(lVar9 / 0x48)) {
        local_b8 = "with messages";
        local_c0 = 0xd;
      }
      break;
    }
LAB_00144769:
    local_b8 = "with message";
    local_c0 = 0xc;
    break;
  case ExplicitFailure:
    local_b0 = "FAILED";
    lVar13 = (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar13 != 0x48) {
      local_b8 = "";
      local_c0 = 0;
      if (1 < (ulong)(lVar13 / 0x48)) {
        local_b8 = "explicitly with messages";
        local_c0 = 0x18;
      }
LAB_00144915:
      local_b0 = "FAILED";
      CVar5 = CVar4;
      goto LAB_00144917;
    }
    lVar13 = 6;
    CVar11 = CVar4;
LAB_001447d1:
    local_c0 = 0x17;
    local_b8 = "explicitly with message";
    break;
  default:
    if (OVar1 != Exception) {
      if (OVar1 == ThrewException) {
        lVar13 = ((long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x48;
        if (lVar13 == 0) {
          local_c0 = 0x21;
          local_b8 = "due to unexpected exception with ";
        }
        else if (lVar13 == 1) {
          local_c0 = 0x28;
          local_b8 = "due to unexpected exception with message";
        }
        else {
          local_c0 = 0x29;
          local_b8 = "due to unexpected exception with messages";
        }
      }
      else if (OVar1 == DidntThrowException) {
        local_c0 = 0x36;
        local_b8 = "because no exception was thrown where one was expected";
      }
      else {
        local_b0 = "";
        lVar13 = 0;
        local_c0 = 0;
        if (OVar1 != FatalErrorCondition) break;
        local_c0 = 0x1e;
        local_b8 = "due to a fatal error condition";
      }
      goto LAB_00144915;
    }
  case Unknown:
  case FailureBit:
    lVar13 = 0x14;
    local_b0 = "** internal error **";
    local_c0 = 0;
    CVar11 = CVar4;
  }
  local_a8._8_4_ = FileName;
  local_a8[0xc] = true;
  local_a8._0_8_ = pCVar2;
  local_38 = this;
  (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0x17);
  local_68._M_dataplus._M_p = (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_68._M_string_length = (_assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(os,(SourceLineInfo *)&local_68);
  std::operator<<(os,": ");
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_a8);
  if ((_assertionStats->totals).assertions.failed + (_assertionStats->totals).assertions.passed +
      (_assertionStats->totals).assertions.failedButOk +
      (_assertionStats->totals).assertions.skipped == 0) {
    std::operator<<(os,'\n');
  }
  else {
    if (lVar13 != 0) {
      local_a8[0xc] = true;
      local_a8._0_8_ = pCVar2;
      local_a8._8_4_ = CVar11;
      (*pCVar2->_vptr_ColourImpl[2])(pCVar2,(ulong)CVar11);
      poVar10 = (ostream *)std::ostream::write((char *)os,(long)local_b0);
      std::operator<<(poVar10,":\n");
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_a8);
    }
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
      local_68._M_string_length = CONCAT35(local_68._M_string_length._5_3_,0x100000005);
      local_68._M_dataplus._M_p = (pointer)pCVar2;
      (*pCVar2->_vptr_ColourImpl[2])(pCVar2,5);
      poVar10 = std::operator<<(os,"  ");
      AssertionResult::getExpressionInMacro_abi_cxx11_
                ((string *)local_a8,&_assertionStats->assertionResult);
      poVar10 = std::operator<<(poVar10,(string *)local_a8);
      std::operator<<(poVar10,'\n');
      std::__cxx11::string::~string((string *)local_a8);
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_68);
    }
    bVar7 = AssertionResult::hasExpandedExpression(&_assertionStats->assertionResult);
    if (bVar7) {
      std::operator<<(os,"with expansion:\n");
      local_48.m_code = BrightYellow;
      local_48.m_engaged = true;
      local_48.m_colourImpl = pCVar2;
      (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0x16);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_68,&_assertionStats->assertionResult)
      ;
      TextFlow::Column::Column((Column *)local_a8,&local_68);
      local_78 = 2;
      TextFlow::operator<<(os,(Column *)local_a8);
      std::operator<<(os,'\n');
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)&local_68);
      ColourImpl::ColourGuard::~ColourGuard(&local_48);
    }
  }
  if (local_c0 != 0) {
    poVar10 = (ostream *)std::ostream::write((char *)os,(long)local_b8);
    poVar10 = std::operator<<(poVar10,':');
    std::operator<<(poVar10,'\n');
  }
  pMVar3 = (_assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar12 = (_assertionStats->infoMessages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start; pMVar12 != pMVar3; pMVar12 = pMVar12 + 1) {
    if ((bool)(pMVar12->type != Info | bVar6)) {
      TextFlow::Column::Column((Column *)local_a8,&pMVar12->message);
      local_78 = 2;
      TextFlow::operator<<(os,(Column *)local_a8);
      std::operator<<(os,'\n');
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  std::operator<<((local_38->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    // TODO: Make configurable whether skips should be printed
    if (!includeResults && result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip)
        return;

    lazyPrint();

    ConsoleAssertionPrinter printer(m_stream, _assertionStats, m_colour.get(), includeResults);
    printer.print();
    m_stream << '\n' << std::flush;
}